

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SimpleRecurrentLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_simplerecurrent(NeuralNetworkLayer *this)

{
  bool bVar1;
  SimpleRecurrentLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_simplerecurrent(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_simplerecurrent(this);
    this_00 = (SimpleRecurrentLayerParams *)operator_new(0x48);
    SimpleRecurrentLayerParams::SimpleRecurrentLayerParams(this_00);
    (this->layer_).simplerecurrent_ = this_00;
  }
  return (SimpleRecurrentLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SimpleRecurrentLayerParams* NeuralNetworkLayer::mutable_simplerecurrent() {
  if (!has_simplerecurrent()) {
    clear_layer();
    set_has_simplerecurrent();
    layer_.simplerecurrent_ = new ::CoreML::Specification::SimpleRecurrentLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.simpleRecurrent)
  return layer_.simplerecurrent_;
}